

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

ostream * wasm::operator<<(ostream *os,Array *array)

{
  ostream *poVar1;
  undefined1 local_a0 [96];
  bool local_40;
  _Any_data local_38;
  _Manager_type local_28;
  
  anon_unknown_0::TypePrinter::TypePrinter((TypePrinter *)local_a0,os);
  poVar1 = anon_unknown_0::TypePrinter::print((TypePrinter *)local_a0,array);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_40 == true) {
    local_40 = false;
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a0 + 0x28));
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Array array) {
  return TypePrinter(os).print(array);
}